

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transition.cc
# Opt level: O1

bool tchecker::syncprod::operator==(transition_t *t1,transition_t *t2)

{
  make_array_t<unsigned_int,_4UL,_tchecker::vedge_base_t> *a1;
  make_array_t<unsigned_int,_4UL,_tchecker::vedge_base_t> *a2;
  bool bVar1;
  
  if (t1->_sync_id != t2->_sync_id) {
    return false;
  }
  a1 = (make_array_t<unsigned_int,_4UL,_tchecker::vedge_base_t> *)(t1->_vedge)._t;
  if ((a1 != (make_array_t<unsigned_int,_4UL,_tchecker::vedge_base_t> *)0x0) &&
     (a2 = (make_array_t<unsigned_int,_4UL,_tchecker::vedge_base_t> *)(t2->_vedge)._t,
     a2 != (make_array_t<unsigned_int,_4UL,_tchecker::vedge_base_t> *)0x0)) {
    bVar1 = tchecker::operator==(a1,a2);
    return bVar1;
  }
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1d0,
                "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::vedge_t>]"
               );
}

Assistant:

bool operator==(tchecker::syncprod::transition_t const & t1, tchecker::syncprod::transition_t const & t2)
{
  return (static_cast<tchecker::ts::transition_t const &>(t1) == static_cast<tchecker::ts::transition_t const &>(t2) &&
          (t1.sync_id() == t2.sync_id()) && (t1.vedge() == t2.vedge()));
}